

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions.c
# Opt level: O2

_InstInfo * inst_lookup(_CodeInfo *ci,_PrefixState *ps,int *isPrefixed)

{
  byte bVar1;
  int iVar2;
  byte bVar3;
  byte bVar4;
  uint uVar5;
  _InstNode *p_Var6;
  _InstInfo *p_Var7;
  _InstInfoEx *p_Var8;
  _InstInfoEx *p_Var9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  ushort uVar14;
  byte *pbVar15;
  ushort uVar16;
  bool bVar17;
  
  pbVar15 = ci->code;
  bVar4 = *pbVar15;
  if (PrefixTables[(ci->dt & ~Decode32Bits) << 7 | (uint)bVar4] == 0) {
    iVar11 = ci->codeLen;
  }
  else {
    *isPrefixed = 1;
    prefixes_decode(ci,ps);
    iVar11 = ci->codeLen;
    if (iVar11 < 1) {
      return (_InstInfo *)0x0;
    }
    pbVar15 = ci->code;
    if ((ps->decodedPrefixes >> 0x1d & 1) != 0) {
      if ((ps->decodedPrefixes & 0x2002070) != 0) {
        return (_InstInfo *)0x0;
      }
      bVar4 = *ps->vexPos;
      uVar13 = (uint)bVar4;
      if (ps->prefixExtType == PET_VEX2BYTES) {
        ps->vexV = ~(uint)bVar4 >> 3 & 0xf;
LAB_00104177:
        p_Var6 = &Table_0F;
      }
      else {
        uVar10 = bVar4 & 0x1f;
        bVar4 = ps->vexPos[1];
        uVar13 = (uint)bVar4;
        ps->vexV = ~(uint)bVar4 >> 3 & 0xf;
        if (uVar10 == 1) goto LAB_00104177;
        if (uVar10 == 3) {
          p_Var6 = &Table_0F_3A;
        }
        else {
          if (uVar10 != 2) {
            return (_InstInfo *)0x0;
          }
          p_Var6 = &Table_0F_38;
        }
      }
      uVar14 = *p_Var6;
      ci->codeLen = iVar11 + -1;
      uVar14 = InstructionsTree[(uint)*pbVar15 + (uVar14 & 0x1fff)];
      if (uVar14 == 0) {
        return (_InstInfo *)0x0;
      }
      uVar10 = (uint)(uVar14 >> 0xd);
      if (uVar10 - 1 < 2) {
        return (_InstInfo *)0x0;
      }
      if (uVar10 == 6) {
        return (_InstInfo *)0x0;
      }
      uVar13 = uVar13 & 3 | 4;
      if (uVar10 == 7) goto LAB_00104493;
      pbVar15 = pbVar15 + 1;
      ci->code = pbVar15;
      ci->codeLen = iVar11 + -2;
      if (iVar11 + -1 == 0) {
        return (_InstInfo *)0x0;
      }
      if (uVar10 == 5) {
        bVar4 = *pbVar15;
LAB_00104478:
        uVar14 = InstructionsTree[(uint)bVar4 + (uVar14 & 0x1fff)];
      }
      else if (uVar10 == 4) {
        bVar4 = *pbVar15 >> 3 & 7;
        goto LAB_00104478;
      }
      if (uVar14 < 0xe000) {
        return (_InstInfo *)0x0;
      }
LAB_00104493:
      p_Var7 = inst_get_info(uVar14,uVar13);
      if (p_Var7 != (_InstInfo *)0x0) {
        bVar4 = (byte)p_Var7[1].sharedIndex;
        if ((bVar4 & 0x20) != 0) {
          p_Var7 = inst_vex_mod_lookup(ci,uVar14,p_Var7,uVar13);
          if (p_Var7 == (_InstInfo *)0x0) {
            return (_InstInfo *)0x0;
          }
          bVar4 = (byte)p_Var7[1].sharedIndex;
        }
        if (((bVar4 & 0x10) == 0) || ((ps->vrex & 0x10) != 0)) {
          if ((bVar4 & 0x40) == 0) {
            return p_Var7;
          }
          if (ps->vexV != 0) {
            return (_InstInfo *)0x0;
          }
          return p_Var7;
        }
      }
      return (_InstInfo *)0x0;
    }
    bVar4 = *pbVar15;
  }
  iVar11 = iVar11 + -1;
  ci->codeLen = iVar11;
  uVar13 = 0;
  bVar3 = bVar4;
  if (bVar4 == 0x9b) {
    prefixes_ignore_all(ps);
    pbVar15 = ci->code + 1;
    ci->code = pbVar15;
    iVar2 = ci->codeLen;
    iVar11 = iVar2 + -1;
    ci->codeLen = iVar11;
    if (iVar2 < 1) {
      return (_InstInfo *)0x0;
    }
    bVar3 = *pbVar15;
    uVar13 = 1;
  }
  uVar14 = InstructionsTree[bVar3];
  if (uVar14 == 0) {
    return (_InstInfo *)0x0;
  }
  uVar16 = uVar14 >> 0xd;
  if ((bVar4 != 0x9b) && (-1 < (short)uVar14)) {
    if (uVar16 == 2) {
      return &InstInfosEx[uVar14 & 0x1fff].BASE;
    }
    if (uVar16 == 3) {
      if (bVar3 == 99) {
        if (ci->dt == Decode64Bits) {
          return &II_MOVSXD;
        }
      }
      else if (bVar3 == 0x8d) {
        ps->decodedPrefixes = ps->decodedPrefixes & 0xffffe07f;
        ps->unusedPrefixesMask = ps->unusedPrefixesMask | ps->pfxIndexer[2];
      }
      else if (bVar3 == 0x90) {
        if ((ps->decodedPrefixes & 0x40) != 0) {
          *(byte *)&ps->usedPrefixes = (byte)ps->usedPrefixes | 0x40;
          return &II_PAUSE;
        }
        uVar13 = ps->vrex;
        if ((uVar13 & 8) != 0) {
          pbVar15 = (byte *)((long)&ps->usedPrefixes + 3);
          *pbVar15 = *pbVar15 | 2;
        }
        if ((uVar13 & 1) == 0) {
          return &II_NOP;
        }
        if (ci->dt != Decode64Bits) {
          return &II_NOP;
        }
      }
    }
    return (_InstInfo *)((long)&InstInfos[0].sharedIndex + (ulong)((uVar14 & 0x1fff) << 2));
  }
  ci->code = pbVar15 + 1;
  ci->codeLen = iVar11 + -1;
  if (iVar11 < 1) {
    return (_InstInfo *)0x0;
  }
  bVar1 = pbVar15[1];
  if ((bVar4 != 0x9b) && (uVar16 == 4)) {
    uVar13 = bVar1 >> 3 & 7;
    goto LAB_00104245;
  }
  if (uVar16 != 6) {
    if (bVar4 == 0x9b) {
      return (_InstInfo *)0x0;
    }
    if (uVar16 == 5) {
      uVar14 = InstructionsTree[(uVar14 & 0x1fff) + (uint)bVar1];
      if (uVar14 == 0) {
        return (_InstInfo *)0x0;
      }
      if ((bVar3 == 0xf) && (bVar1 == 0xf)) {
        return &II_3DNOW;
      }
      uVar16 = uVar14 >> 0xd;
      if (-1 < (short)uVar14) {
        p_Var7 = (_InstInfo *)((long)&InstInfos[0].sharedIndex + (ulong)((uVar14 & 0x1fff) * 4));
        p_Var9 = InstInfosEx + (uVar14 & 0x1fff);
        bVar17 = uVar16 == 1;
        goto LAB_001045d0;
      }
      if (uVar16 == 7) goto LAB_0010465b;
    }
    uVar13 = (uint)uVar14;
    ci->code = pbVar15 + 2;
    ci->codeLen = iVar11 + -2;
    if (iVar11 + -1 == 0) {
      return (_InstInfo *)0x0;
    }
    bVar4 = pbVar15[2];
    if (uVar16 != 6) {
      if (uVar16 == 5) {
        uVar14 = InstructionsTree[(uint)bVar4 + (uVar13 & 0x1fff)];
        if (uVar14 == 0) {
          return (_InstInfo *)0x0;
        }
        if ((short)uVar14 < 0) {
          if (uVar14 >> 0xd != 7) {
            return (_InstInfo *)0x0;
          }
LAB_0010465b:
          p_Var7 = inst_lookup_prefixed(uVar14,ps);
          return p_Var7;
        }
        p_Var7 = (_InstInfo *)((long)&InstInfos[0].sharedIndex + (ulong)((uVar14 & 0x1fff) * 4));
        p_Var9 = InstInfosEx + (uVar14 & 0x1fff);
        bVar17 = uVar14 >> 0xd == 1;
      }
      else {
        if (uVar16 != 4) {
          return (_InstInfo *)0x0;
        }
        uVar14 = InstructionsTree[(bVar4 >> 3 & 7) + (uVar13 & 0x1fff)];
        if (uVar14 == 0) {
          return (_InstInfo *)0x0;
        }
        if ((short)uVar14 < 0) {
          p_Var7 = inst_lookup_prefixed(uVar14,ps);
          if (p_Var7 == (_InstInfo *)0x0) {
            return (_InstInfo *)0x0;
          }
          if (p_Var7->opcodeId == 0x2712) {
            if (0xbf < bVar1) {
              return &II_RDRAND;
            }
            return p_Var7;
          }
          return p_Var7;
        }
        p_Var7 = (_InstInfo *)((long)&InstInfos[0].sharedIndex + (ulong)((uVar14 & 0x1fff) * 4));
        p_Var9 = InstInfosEx + (uVar14 & 0x1fff);
        bVar17 = (uVar14 & 0x6000) == 0x2000;
      }
LAB_001045d0:
      if (bVar17) {
        return p_Var7;
      }
      return &p_Var9->BASE;
    }
    uVar16 = InstructionsTree[(bVar4 >> 3 & 7) + (uVar13 & 0x1fff)];
    if (uVar16 >> 0xd == 2) {
      p_Var9 = InstInfosEx + (uVar16 & 0x1fff);
LAB_0010461f:
      if ((FlagsTable[InstSharedInfoTable[(p_Var9->BASE).sharedIndex].flagsIndex] & 2) != 0) {
        return &p_Var9->BASE;
      }
      if (bVar4 < 0xc0) {
        return &p_Var9->BASE;
      }
    }
    else {
      if (uVar16 >> 0xd == 1) {
        p_Var9 = (_InstInfoEx *)((long)&InstInfos[0].sharedIndex + (ulong)((uVar16 & 0x1fff) << 2));
        goto LAB_0010461f;
      }
      if (bVar4 < 0xc0) {
        return (_InstInfo *)0x0;
      }
    }
    uVar13 = bVar4 - 0xb8;
    goto LAB_00104245;
  }
  uVar10 = uVar14 & 0x1fff;
  uVar12 = bVar1 >> 3 & 7;
  uVar14 = InstructionsTree[uVar12 + uVar10];
  if (uVar14 >> 0xd == 2) {
    p_Var9 = InstInfosEx + (uVar14 & 0x1fff);
LAB_0010438a:
    if ((FlagsTable[InstSharedInfoTable[(p_Var9->BASE).sharedIndex].flagsIndex] & 2) != 0) {
      return &p_Var9->BASE;
    }
  }
  else if (uVar14 >> 0xd == 1) {
    p_Var9 = (_InstInfoEx *)((long)&InstInfos[0].sharedIndex + (ulong)((uVar14 & 0x1fff) << 2));
    goto LAB_0010438a;
  }
  uVar5 = bVar1 - 0xb8;
  if (bVar1 < 0xc0) {
    uVar5 = uVar12;
  }
  uVar14 = InstructionsTree[uVar5 + uVar10];
  if (uVar14 == 0) {
    return (_InstInfo *)0x0;
  }
  if (-1 < (short)uVar14) {
    p_Var9 = InstInfosEx + (uVar14 & 0x1fff);
    if ((uVar14 & 0x6000) == 0x2000) {
      p_Var9 = (_InstInfoEx *)((long)&InstInfos[0].sharedIndex + (ulong)((uVar14 & 0x1fff) * 4));
    }
    p_Var8 = (_InstInfoEx *)0x0;
    if ((*(byte *)((long)FlagsTable +
                  (ulong)InstSharedInfoTable[(p_Var9->BASE).sharedIndex].flagsIndex * 4 + 1) & 0x20)
        != 0) {
      p_Var8 = p_Var9;
    }
    if (bVar4 != 0x9b) {
      return &p_Var9->BASE;
    }
    return &p_Var8->BASE;
  }
LAB_00104245:
  p_Var7 = inst_get_info(uVar14,uVar13);
  return p_Var7;
}

Assistant:

_InstInfo* inst_lookup(_CodeInfo* ci, _PrefixState* ps, int* isPrefixed)
{
	unsigned int tmpIndex0, tmpIndex1, tmpIndex2;
	int instType;
	_InstNode in;
	_InstInfo* ii = NULL;
	int isWaitIncluded = FALSE;

	/* Always safe to read first byte codeLen > 0. */
	tmpIndex0 = *ci->code;

	if (prefixes_is_valid((unsigned char)tmpIndex0, ci->dt)) {
		*isPrefixed = TRUE;
		prefixes_decode(ci, ps);
		if (ci->codeLen < 1) return NULL; /* No more bytes for opcode, halt. */
		tmpIndex0 = *ci->code; /* Reload. */

		/* If there are too many prefixes, it will be checked later in decode_inst. */

		/* See whether we have to handle a VEX prefixed instruction. */
		if (ps->decodedPrefixes & INST_PRE_VEX) {
			ii = inst_vex_lookup(ci, ps);
			if (ii != NULL) {
				/* Make sure that VEX.L exists when forced. */
				if ((((_InstInfoEx*)ii)->flagsEx & INST_FORCE_VEXL) && (~ps->vrex & PREFIX_EX_L)) return NULL;
				/* If the instruction doesn't use VEX.vvvv it must be zero. */
				if ((((_InstInfoEx*)ii)->flagsEx & INST_VEX_V_UNUSED) && ps->vexV) return NULL;
			}
			return ii;
		}
	}

	/* Account first byte, we know it's safe to read. */
	ci->codeLen -= 1;

	/* Check for special 0x9b, WAIT instruction, which can be part of some instructions(x87). */
	if (tmpIndex0 == INST_WAIT_INDEX) {
		/* Only OCST_1dBYTES get a chance to include this byte as part of the opcode. */
		isWaitIncluded = TRUE;

		/* Ignore all prefixes, since they are useless and operate on the WAIT instruction itself. */
		prefixes_ignore_all(ps);

		/* Move to next code byte as a new whole instruction. */
		ci->code += 1;
		ci->codeLen -= 1;
		if (ci->codeLen < 0) return NULL; /* Faster to return NULL, it will be detected as WAIT later anyway. */
		/* Since we got a WAIT prefix, we re-read the first byte. */
		tmpIndex0 = *ci->code;
	}

	/* Walk first byte in InstructionsTree root. */
	in = InstructionsTree[tmpIndex0];
	if ((uint32_t)in == INT_NOTEXISTS) return NULL;
	instType = INST_NODE_TYPE(in);

	/* Single byte instruction (OCST_1BYTE). */
	if ((instType < INT_INFOS) && (!isWaitIncluded)) {
		/* Some single byte instructions need extra treatment. */
		if (instType == INT_INFO_TREAT) {
			if (tmpIndex0 == INST_NOP_INDEX) { /* Nopnopnop */
				/* Check for Pause, since it's prefixed with 0xf3, which is not a real mandatory prefix. */
				if (ps->decodedPrefixes & INST_PRE_REP) {
					/* Flag this prefix as used. */
					ps->usedPrefixes |= INST_PRE_REP;
					return &II_PAUSE;
				}

				/*
				 * Treat NOP/XCHG specially.
				 * If we're not in 64bits restore XCHG to NOP, since in the DB it's XCHG.
				 * Else if we're in 64bits examine REX, if exists, and decide which instruction should go to output.
				 * 48 90 XCHG RAX, RAX is a true NOP (eat REX in this case because it's valid).
				 * 90 XCHG EAX, EAX is a true NOP (and not high dword of RAX = 0 although it should be a 32 bits operation).
				 * Note that if the REX.B is used, then the register is not RAX anymore but R8, which means it's not a NOP.
				 */
				if (ps->vrex & PREFIX_EX_W) ps->usedPrefixes |= INST_PRE_REX;
				if ((ci->dt != Decode64Bits) || (~ps->vrex & PREFIX_EX_B)) return &II_NOP;
			}
			else if (tmpIndex0 == INST_LEA_INDEX) {
				/* Ignore segment override prefixes for LEA instruction. */
				ps->decodedPrefixes &= ~INST_PRE_SEGOVRD_MASK;
				/* Update unused mask for ignoring segment prefix. */
				prefixes_ignore(ps, PFXIDX_SEG);
			}
			else if (tmpIndex0 == INST_ARPL_INDEX) {
					/*
					 * ARPL/MOVSXD share the same opcode, and both have different operands and mnemonics, of course.
					 * Practically, I couldn't come up with a comfortable way to merge the operands' types of ARPL/MOVSXD.
					 * And since the DB can't be patched dynamically, because the DB has to be multi-threaded compliant,
					 * I have no choice but to check for ARPL/MOVSXD right here - "right about now, the funk soul brother, check it out now, the funk soul brother...", fatboy slim
					 */
					if (ci->dt == Decode64Bits) {
						return &II_MOVSXD;
					} /* else ARPL will be returned because its defined in the DB already. */
			}
		}
		/*
		 * Return the 1 byte instruction we found.
		 * We can have three node types here: infoex, info_treat and info.
		 * The latter two are really the same basic structure.
		 */
		return instType == INT_INFOEX ? (_InstInfo*)&InstInfosEx[INST_NODE_INDEX(in)] : &InstInfos[INST_NODE_INDEX(in)];
	}

	/* Read second byte, still doesn't mean all of its bits are used (I.E: ModRM). */
	ci->code += 1;
	ci->codeLen -= 1;
	if (ci->codeLen < 0) return NULL;
	tmpIndex1 = *ci->code;

	/* Try single byte instruction + reg bits (OCST_13BYTES). */
	if ((instType == INT_LIST_GROUP) && (!isWaitIncluded)) return inst_get_info(in, (tmpIndex1 >> 3) & 7);

	/* Try single byte instruction + reg byte OR one whole byte (OCST_1dBYTES). */
	if (instType == INT_LIST_DIVIDED) {

		/* Checking for inst by REG bits is higher priority if it's found not to be divided instruction. */
		{
			_InstNode in2 = InstructionsTree[INST_NODE_INDEX(in) + ((tmpIndex1 >> 3) & 7)];
			/*
			 * Do NOT check for NULL here, since we do a bit of a guess work,
			 * hence we don't override 'in', cause we might still need it.
			 */
			instType = INST_NODE_TYPE(in2);

			if (instType == INT_INFO) ii = &InstInfos[INST_NODE_INDEX(in2)];
			else if (instType == INT_INFOEX) ii = (_InstInfo*)&InstInfosEx[INST_NODE_INDEX(in2)];
			if ((ii != NULL) && (INST_INFO_FLAGS(ii) & INST_NOT_DIVIDED)) return ii;
			/* ii is reset below. */
		}

		/* Continue normally because of wait prefix. */
		if (tmpIndex1 < INST_DIVIDED_MODRM) {
			/* An instruction which requires a ModR/M byte. Thus it's 1.3 bytes long instruction. */
			tmpIndex1 = (tmpIndex1 >> 3) & 7; /* Isolate the 3 REG/OPCODE bits. */
		}
		else { /* Normal 2 bytes instruction. */
		 /*
		  * Divided instructions can't be in the range of 0x8-0xc0.
		  * That's because 0-8 are used for 3 bits group.
		  * And 0xc0-0xff are used for not-divided instruction.
		  * So the in between range is omitted, thus saving some more place in the tables.
		  */
			tmpIndex1 -= INST_DIVIDED_MODRM - 8;
		}

		in = InstructionsTree[INST_NODE_INDEX(in) + tmpIndex1];
		if (in == INT_NOTEXISTS) return NULL;
		instType = INST_NODE_TYPE(in);

		if (instType < INT_INFOS) {
			/* If the instruction doesn't support the wait (marked as opsize) as part of the opcode, it's illegal. */
			ii = instType == INT_INFO ? &InstInfos[INST_NODE_INDEX(in)] : (_InstInfo*)&InstInfosEx[INST_NODE_INDEX(in)];
			if ((~INST_INFO_FLAGS(ii) & INST_PRE_OP_SIZE) && (isWaitIncluded)) return NULL;
			return ii;
		}
		/*
		 * If we got here the instruction can support the wait prefix, so see if it was part of the stream.
		 * Examine prefixed table, specially used for 0x9b, since it's optional.
		 * No Wait: index = 0.
		 * Wait Exists, index = 1.
		 */
		return inst_get_info(in, isWaitIncluded);
	}

	/* Don't allow to continue if WAIT is part of the opcode, because there are no instructions that include it. */
	if (isWaitIncluded) return NULL;

	/* Try 2 bytes long instruction (doesn't include ModRM byte). */
	if (instType == INT_LIST_FULL) {
		in = InstructionsTree[INST_NODE_INDEX(in) + tmpIndex1];
		if (in == INT_NOTEXISTS) return NULL;
		instType = INST_NODE_TYPE(in);

		/* This is where we check if we just read two escape bytes in a row, which means it is a 3DNow! instruction. */
		if ((tmpIndex0 == _3DNOW_ESCAPE_BYTE) && (tmpIndex1 == _3DNOW_ESCAPE_BYTE)) return &II_3DNOW;

		/* 2 bytes instruction (OCST_2BYTES). */
		if (instType < INT_INFOS)
			return instType == INT_INFO ? &InstInfos[INST_NODE_INDEX(in)] : (_InstInfo*)&InstInfosEx[INST_NODE_INDEX(in)];

		/*
		 * 2 bytes + mandatory prefix.
		 * Mandatory prefixes can be anywhere in the prefixes.
		 * There cannot be more than one mandatory prefix, unless it's a normal operand size prefix.
		 */
		if (instType == INT_LIST_PREFIXED) return inst_lookup_prefixed(in, ps);
	}

	/* Read third byte, still doesn't mean all of its bits are used (I.E: ModRM). */
	ci->code += 1;
	ci->codeLen -= 1;
	if (ci->codeLen < 0) return NULL;
	tmpIndex2 = *ci->code;

	/* Try 2 bytes + reg instruction (OCST_23BYTES). */
	if (instType == INT_LIST_GROUP) {
		in = InstructionsTree[INST_NODE_INDEX(in) + ((tmpIndex2 >> 3) & 7)];
		if (in == INT_NOTEXISTS) return NULL;
		instType = INST_NODE_TYPE(in);

		if (instType < INT_INFOS)
			return instType == INT_INFO ? &InstInfos[INST_NODE_INDEX(in)] : (_InstInfo*)&InstInfosEx[INST_NODE_INDEX(in)];

		/* It has to be a prefixed table then. */
		ii = inst_lookup_prefixed(in, ps);
		/* RDRAND and VMPTRLD share same 2.3 bytes opcode, and alternate on the MOD bits. See insts.h for more info. */
		if ((ii != NULL) && (ii->opcodeId == I_VMPTRLD) && (tmpIndex1 >= INST_DIVIDED_MODRM)) return &II_RDRAND;
		return ii;
	}

	/* Try 2 bytes + divided range (OCST_2dBYTES). */
	if (instType == INT_LIST_DIVIDED) {
		_InstNode in2 = InstructionsTree[INST_NODE_INDEX(in) + ((tmpIndex2 >> 3) & 7)];
		/*
		 * Do NOT check for NULL here, since we do a bit of a guess work,
		 * hence we don't override 'in', cause we might still need it.
		 */
		instType = INST_NODE_TYPE(in2);

		if (instType == INT_INFO) ii = &InstInfos[INST_NODE_INDEX(in2)];
		else if (instType == INT_INFOEX) ii = (_InstInfo*)&InstInfosEx[INST_NODE_INDEX(in2)];

		/*
		 * OCST_2dBYTES is complex, because there are a few instructions which are not divided in some special cases.
		 * If the instruction wasn't divided (but still it must be a 2.3 because we are in divided category)
		 * or it was an official 2.3 (because its index was less than 0xc0) -
		 * Then it means the instruction should be using the REG bits, otherwise give a chance to range 0xc0-0xff.
		 */
		 /* If we found an instruction only by its REG bits, AND it is not divided, then return it. */
		if ((ii != NULL) && (INST_INFO_FLAGS(ii) & INST_NOT_DIVIDED)) return ii;
		/* Otherwise, if the range is above 0xc0, try the special divided range (range 0x8-0xc0 is omitted). */
		if (tmpIndex2 >= INST_DIVIDED_MODRM) return inst_get_info(in, tmpIndex2 - INST_DIVIDED_MODRM + 8);

		/* It might be that we got here without touching ii in the above if statements, then it becomes an invalid instruction prolly. */
		return ii;
	}

	/* Try 3 full bytes (OCST_3BYTES - no ModRM byte). */
	if (instType == INT_LIST_FULL) {
		/* OCST_3BYTES. */
		in = InstructionsTree[INST_NODE_INDEX(in) + tmpIndex2];
		if (in == INT_NOTEXISTS) return NULL;
		instType = INST_NODE_TYPE(in);

		if (instType < INT_INFOS)
			return instType == INT_INFO ? &InstInfos[INST_NODE_INDEX(in)] : (_InstInfo*)&InstInfosEx[INST_NODE_INDEX(in)];

		if (instType == INT_LIST_PREFIXED) return inst_lookup_prefixed(in, ps);
	}

	/* Kahtchinggg, damn. */
	return NULL;
}